

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O0

int * inform_black_box(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,int *box,
                      inform_error *err)

{
  _Bool _Var1;
  size_t *r_00;
  size_t *s_00;
  bool bVar2;
  size_t *future;
  size_t i;
  size_t *history;
  size_t *data;
  size_t sStack_60;
  _Bool allocate;
  size_t max_s;
  size_t max_r;
  size_t *r_local;
  int *b_local;
  size_t m_local;
  size_t n_local;
  size_t l_local;
  int *series_local;
  
  max_r = (size_t)r;
  r_local = (size_t *)b;
  b_local = (int *)m;
  m_local = n;
  n_local = l;
  l_local = (size_t)series;
  _Var1 = check_arguments(series,l,n,m,b,r,s,err);
  if (_Var1) {
    series_local = (int *)0x0;
  }
  else {
    compute_lengths((size_t *)max_r,s,n_local,&max_s,&stack0xffffffffffffffa0);
    bVar2 = box == (int *)0x0;
    if ((bVar2) &&
       (box = (int *)calloc(m_local * ((long)b_local + (-sStack_60 - max_s) + 1),4),
       box == (int *)0x0)) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x0;
    }
    else {
      r_00 = (size_t *)calloc(n_local << 1,8);
      if (r_00 == (size_t *)0x0) {
        if (bVar2) {
          free(box);
        }
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        series_local = (int *)0x0;
      }
      else {
        if (max_r == 0) {
          for (future = (size_t *)0x0; future < n_local; future = (size_t *)((long)future + 1)) {
            r_00[(long)future] = 1;
          }
        }
        else {
          memcpy(r_00,(void *)max_r,n_local << 3);
        }
        s_00 = r_00 + n_local;
        if (s != (size_t *)0x0) {
          memcpy(s_00,s,n_local << 3);
        }
        accumulate((int *)l_local,n_local,m_local,(size_t)b_local,(int *)r_local,r_00,s_00,max_s,
                   sStack_60,box,err);
        _Var1 = inform_failed(err);
        if (_Var1) {
          if (bVar2) {
            free(box);
          }
          box = (int *)0x0;
        }
        free(r_00);
        series_local = box;
      }
    }
  }
  return series_local;
}

Assistant:

int* inform_black_box(int const *series, size_t l, size_t n, size_t m,
    int const *b, size_t const *r, size_t const *s, int *box, inform_error *err)
{
    if (check_arguments(series, l, n, m, b, r, s, err))
    {
        return NULL;
    }
    size_t max_r, max_s;
    compute_lengths(r, s, l, &max_r, &max_s);

    bool allocate = (box == NULL);
    if (allocate)
    {
        box = calloc(n * (m - max_r - max_s + 1), sizeof(int));
        if (box == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t *data = calloc(2 * l, sizeof(size_t));
    if (data == NULL)
    {
        if (allocate) free(box);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    size_t *history = data;
    if (r == NULL)
    {
        for (size_t i = 0; i < l; ++i) history[i] = 1;
    }
    else
    {
        memcpy(history, r, l * sizeof(size_t));
    }

    size_t *future = data + l;
    if (s != NULL)
    {
        memcpy(future, s, l * sizeof(size_t));
    }

    accumulate(series, l, n, m, b, history, future, max_r, max_s, box, err);

    if (inform_failed(err))
    {
        if (allocate) free(box);
        box = NULL;
    }
    free(data);
    return box;
}